

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::Str::replaceAll(string *str,char replaceWhat,char replaceWith)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char *__old_value;
  undefined1 in_DL;
  undefined1 in_SIL;
  string *in_RDI;
  char *in_stack_ffffffffffffffd8;
  undefined6 in_stack_fffffffffffffff0;
  
  __last._M_current = (char *)::std::__cxx11::string::begin();
  __old_value = (char *)::std::__cxx11::string::end();
  __first._M_current._6_1_ = in_DL;
  __first._M_current._0_6_ = in_stack_fffffffffffffff0;
  __first._M_current._7_1_ = in_SIL;
  ::std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,__last,__old_value,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

std::string& Str::replaceAll(std::string& str, char replaceWhat, char replaceWith) {
  std::replace(str.begin(), str.end(), replaceWhat, replaceWith);
  return str;
}